

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

bool __thiscall helics::CommonCore::isLocal(CommonCore *this,GlobalFederateId global_fedid)

{
  GlobalFederateId local_4c;
  const_iterator local_48;
  BlockIterator<const_helics::FedInfo,_32,_const_helics::FedInfo_*const_*> local_30;
  
  local_4c.gid = global_fedid.gid;
  gmlc::containers::
  DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>::find
            (&local_30,&this->loopFederates,&local_4c);
  gmlc::containers::StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_>::end
            (&local_48,&(this->loopFederates).dataStorage);
  return local_30.vec != local_48.vec || local_30.offset != local_48.offset;
}

Assistant:

bool CommonCore::isLocal(GlobalFederateId global_fedid) const
{
    return (loopFederates.find(global_fedid) != loopFederates.end());
}